

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O3

MPP_RET mpp_packet_copy(MppPacket dst,MppPacket src)

{
  MPP_RET MVar1;
  
  MVar1 = check_is_mpp_packet_f(dst,"mpp_packet_copy");
  if ((MVar1 == MPP_OK) && (MVar1 = check_is_mpp_packet_f(src,"mpp_packet_copy"), MVar1 == MPP_OK))
  {
    memcpy(*(void **)((long)dst + 0x10),*(void **)((long)src + 0x10),*(size_t *)((long)src + 0x20));
    *(undefined8 *)((long)dst + 0x20) = *(undefined8 *)((long)src + 0x20);
    if (*(int *)((long)src + 0x58) == 0) {
      return MPP_OK;
    }
    mpp_packet_copy_segment_info(dst,src);
    return MPP_OK;
  }
  _mpp_log_l(2,"mpp_packet","invalid input: dst %p src %p\n","mpp_packet_copy",dst,src);
  return MPP_ERR_UNKNOW;
}

Assistant:

MPP_RET mpp_packet_copy(MppPacket dst, MppPacket src)
{
    if (check_is_mpp_packet(dst) || check_is_mpp_packet(src)) {
        mpp_err_f("invalid input: dst %p src %p\n", dst, src);
        return MPP_ERR_UNKNOW;
    }

    MppPacketImpl *dst_impl = (MppPacketImpl *)dst;
    MppPacketImpl *src_impl = (MppPacketImpl *)src;

    memcpy(dst_impl->pos, src_impl->pos, src_impl->length);
    dst_impl->length = src_impl->length;

    if (src_impl->segment_nb)
        mpp_packet_copy_segment_info(dst, src);

    return MPP_OK;
}